

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

fdb_status filemgr_commit(filemgr *file,bool sync,err_log_callback *log_callback)

{
  fdb_status fVar1;
  uint64_t bmp_revnum;
  
  if (sb_ops.get_bmp_revnum == (_func_uint64_t_filemgr_ptr *)0x0) {
    bmp_revnum = 0;
  }
  else {
    bmp_revnum = (*sb_ops.get_bmp_revnum)(file);
  }
  fVar1 = filemgr_commit_bid(file,0xffffffffffffffff,bmp_revnum,sync,log_callback);
  return fVar1;
}

Assistant:

fdb_status filemgr_commit(struct filemgr *file, bool sync,
                          err_log_callback *log_callback)
{
    // append header at the end of the file
    uint64_t bmp_revnum = 0;
    if (sb_ops.get_bmp_revnum) {
        bmp_revnum = sb_ops.get_bmp_revnum(file);
    }
    return filemgr_commit_bid(file, BLK_NOT_FOUND, bmp_revnum,
                              sync, log_callback);
}